

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O3

string * __thiscall
Download::GetFileExtensionName(string *__return_storage_ptr__,Download *this,string *url)

{
  long lVar1;
  string extensionSeparator;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,".","");
  if (url->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::rfind((char *)url,(ulong)local_60[0],0xffffffffffffffff);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)url);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Download::GetFileExtensionName(const std::string &url)
{ 
	std::string fileExtensionName="";
	std::string extensionSeparator = ".";
	if(!url.empty())
	{
		size_t index = url.rfind(extensionSeparator);
		if(index != std::string::npos)
		{
			fileExtensionName = url.substr(index+extensionSeparator.length());
		}
	}
	return fileExtensionName;
}